

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

NamespaceData * __thiscall
anon_unknown.dwarf_9fd58::FindNamespaceInCurrentScope
          (anon_unknown_dwarf_9fd58 *this,ExpressionContext *ctx,InplaceStr name)

{
  uint uVar1;
  undefined8 *puVar2;
  anon_unknown_dwarf_9fd58 *paVar3;
  bool bVar4;
  long lVar5;
  ScopeData *curr;
  anon_unknown_dwarf_9fd58 *paVar6;
  ulong uVar7;
  InplaceStr local_38;
  
  local_38.end = name.begin;
  for (puVar2 = *(undefined8 **)(this + 0x8158); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    lVar5 = puVar2[2];
    if (lVar5 != 0) goto LAB_0017b637;
  }
  lVar5 = 0;
LAB_0017b637:
  paVar6 = (anon_unknown_dwarf_9fd58 *)(lVar5 + 0x20);
  paVar3 = (anon_unknown_dwarf_9fd58 *)(lVar5 + 0x18);
  if (lVar5 == 0) {
    paVar6 = this + 0x8178;
    paVar3 = this + 0x8170;
  }
  uVar1 = *(uint *)paVar6;
  if ((ulong)uVar1 != 0) {
    lVar5 = *(long *)paVar3;
    uVar7 = 0;
    local_38.begin = (char *)ctx;
    do {
      bVar4 = InplaceStr::operator==((InplaceStr *)(*(long *)(lVar5 + uVar7 * 8) + 0x80),&local_38);
      if (bVar4) {
        return *(NamespaceData **)(lVar5 + uVar7 * 8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  return (NamespaceData *)0x0;
}

Assistant:

NamespaceData* FindNamespaceInCurrentScope(ExpressionContext &ctx, InplaceStr name)
	{
		ArrayView<NamespaceData*> namespaces;

		if(NamespaceData *ns = ctx.GetCurrentNamespace(ctx.scope))
			namespaces = ns->children;
		else
			namespaces = ctx.globalNamespaces;

		for(unsigned i = 0; i < namespaces.size(); i++)
		{
			if(namespaces[i]->name.name == name)
				return namespaces[i];
		}

		return NULL;
	}